

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_block_statemach(connectdata *conn)

{
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  
  pop3c._4_4_ = CURLE_OK;
  while ((conn->proto).imapc.state != IMAP_STOP && pop3c._4_4_ == CURLE_OK) {
    pop3c._4_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,true);
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_block_statemach(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  while(pop3c->state != POP3_STOP && !result)
    result = Curl_pp_statemach(&pop3c->pp, TRUE);

  return result;
}